

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,cmBTStringRange entries,string *config,
          cmGeneratorTarget *headTarget,LinkInterfaceFor interfaceFor,LinkInterfaceField field,
          cmLinkInterface *iface)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  cmSourceFile *this_01;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var4;
  pointer n;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_02;
  string_view arg;
  allocator<char> local_231;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  LookupLinkItemScope scope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1b8;
  cmGeneratorExpression ge;
  string local_198;
  string local_178;
  cmLinkItem item;
  string local_118 [32];
  optional<cmLinkItem> maybeItem;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  _Var4 = entries.Begin._M_current;
  if (_Var4._M_current != entries.End._M_current._M_current) {
    std::__cxx11::string::string((string *)&local_178,(string *)prop);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_178,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_178);
    if (interfaceFor == Usage) {
      dagChecker.TransitivePropertiesOnly = true;
    }
    scope.LG = this->LocalGenerator;
    this_00 = (scope.LG)->Makefile;
    for (; _Var4._M_current != entries.End._M_current._M_current;
        _Var4._M_current = _Var4._M_current + 1) {
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_1b8,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)&(_Var4._M_current)->Backtrace);
      cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_1b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
      std::__cxx11::string::string(local_118,(string *)_Var4._M_current);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
      std::__cxx11::string::~string(local_118);
      *(undefined1 *)
       ((long)cge._M_t.
              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl + 0x49) =
           1;
      psVar3 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)
                          cge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl,this->LocalGenerator,config,headTarget,&dagChecker,this,
                          &headTarget->LinkerLanguage);
      arg._M_str = (psVar3->_M_dataplus)._M_p;
      arg._M_len = psVar3->_M_string_length;
      cmExpandedList_abi_cxx11_(&libs,arg,false);
      pbVar1 = libs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (n = libs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; n != pbVar1; n = n + 1) {
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&item,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 *)cge._M_t.
                                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                   _M_head_impl);
        LookupLinkItem(&maybeItem,this,n,(cmListFileBacktrace *)&item,&scope,
                       (uint)(field != Libraries));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&item.String._M_string_length);
        if (maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
            super__Optional_payload<cmLinkItem,_true,_false,_false>.
            super__Optional_payload_base<cmLinkItem>._M_engaged == true) {
          cmLinkItem::cmLinkItem(&item,(cmLinkItem *)&maybeItem);
          this_02 = &(iface->super_cmLinkInterfaceLibraries).HeadExclude;
          if ((field == HeadExclude) ||
             (this_02 = &(iface->super_cmLinkInterfaceLibraries).HeadInclude, field == HeadInclude))
          {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (this_02,&item);
          }
          else {
            if (item.Target == (cmGeneratorTarget *)0x0) {
              psVar3 = cmLinkItem::AsStr_abi_cxx11_(&item);
              bVar2 = cmsys::SystemTools::FileIsFullPath(psVar3);
              if (bVar2) {
                this_01 = cmMakefile::GetSource(this_00,psVar3,Known);
                if (this_01 != (cmSourceFile *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_198,"EXTERNAL_OBJECT",&local_231);
                  bVar2 = cmSourceFile::GetPropertyAsBool(this_01,&local_198);
                  std::__cxx11::string::~string((string *)&local_198);
                  if (bVar2) {
                    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                              (&(iface->super_cmLinkInterfaceLibraries).Objects,&item);
                    goto LAB_0038a22e;
                  }
                }
              }
            }
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,&item);
          }
LAB_0038a22e:
          cmLinkItem::~cmLinkItem(&item);
        }
        std::_Optional_payload_base<cmLinkItem>::_M_reset
                  ((_Optional_payload_base<cmLinkItem> *)&maybeItem);
      }
      if (*(char *)((long)cge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl + 0x131) != '\0') {
        (iface->super_cmLinkInterfaceLibraries).HadHeadSensitiveCondition = true;
      }
      if (*(char *)((long)cge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl + 0x130) == '\x01') {
        (iface->super_cmLinkInterfaceLibraries).HadContextSensitiveCondition = true;
      }
      if (*(char *)((long)cge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl + 0x132) == '\x01') {
        iface->HadLinkLanguageSensitiveCondition = true;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&libs);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr(&cge);
      cmGeneratorExpression::~cmGeneratorExpression(&ge);
    }
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(
  std::string const& prop, cmBTStringRange entries, std::string const& config,
  cmGeneratorTarget const* headTarget, LinkInterfaceFor interfaceFor,
  LinkInterfaceField field, cmLinkInterface& iface) const
{
  if (entries.empty()) {
    return;
  }
  // Keep this logic in sync with ComputeLinkImplementationLibraries.
  cmGeneratorExpressionDAGChecker dagChecker(this, prop, nullptr, nullptr);
  // The $<LINK_ONLY> expression may be in a link interface to specify
  // private link dependencies that are otherwise excluded from usage
  // requirements.
  if (interfaceFor == LinkInterfaceFor::Usage) {
    dagChecker.SetTransitivePropertiesOnly();
  }
  cmMakefile const* mf = this->LocalGenerator->GetMakefile();
  LookupLinkItemScope scope{ this->LocalGenerator };
  for (BT<std::string> const& entry : entries) {
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::vector<std::string> libs = cmExpandedList(
      cge->Evaluate(this->LocalGenerator, config, headTarget, &dagChecker,
                    this, headTarget->LinkerLanguage));
    for (std::string const& lib : libs) {
      if (cm::optional<cmLinkItem> maybeItem = this->LookupLinkItem(
            lib, cge->GetBacktrace(), &scope,
            field == LinkInterfaceField::Libraries ? LookupSelf::No
                                                   : LookupSelf::Yes)) {
        cmLinkItem item = std::move(*maybeItem);

        if (field == LinkInterfaceField::HeadInclude) {
          iface.HeadInclude.emplace_back(std::move(item));
          continue;
        }
        if (field == LinkInterfaceField::HeadExclude) {
          iface.HeadExclude.emplace_back(std::move(item));
          continue;
        }
        if (!item.Target) {
          // Report explicitly linked object files separately.
          std::string const& maybeObj = item.AsStr();
          if (cmSystemTools::FileIsFullPath(maybeObj)) {
            cmSourceFile const* sf =
              mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
            if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
              iface.Objects.emplace_back(std::move(item));
              continue;
            }
          }
        }

        iface.Libraries.emplace_back(std::move(item));
      }
    }
    if (cge->GetHadHeadSensitiveCondition()) {
      iface.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      iface.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      iface.HadLinkLanguageSensitiveCondition = true;
    }
  }
}